

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_beta_decode_char(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  int iVar1;
  uint uVar2;
  int local_34;
  int n;
  int i;
  int *out_size_local;
  char *out_local;
  cram_block *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  if ((c->field_6).external.type == 0) {
    local_34 = 0;
    iVar1 = *out_size;
    for (; local_34 < iVar1; local_34 = local_34 + 1) {
      out[local_34] = -(char)(c->field_6).huffman.ncodes;
    }
  }
  else {
    local_34 = 0;
    iVar1 = *out_size;
    for (; local_34 < iVar1; local_34 = local_34 + 1) {
      uVar2 = get_bits_MSB(in,(c->field_6).beta.nbits);
      out[local_34] = (char)uVar2 - (char)(c->field_6).huffman.ncodes;
    }
  }
  return 0;
}

Assistant:

int cram_beta_decode_char(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int i, n;

    if (c->beta.nbits) {
	for (i = 0, n = *out_size; i < n; i++)
	    out[i] = get_bits_MSB(in, c->beta.nbits) - c->beta.offset;
    } else {
	for (i = 0, n = *out_size; i < n; i++)
	    out[i] = -c->beta.offset;
    }

    return 0;
}